

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O0

int MAFSA_automaton_val_to_int_pair(MAFSA_letter *l,size_t sz_l,MAFSA_letter delim,int *out)

{
  bool bVar1;
  int iVar2;
  int valid;
  int count;
  int i;
  int *out_local;
  MAFSA_letter delim_local;
  size_t sz_l_local;
  MAFSA_letter *l_local;
  int local_4;
  
  bVar1 = false;
  count = 0;
  iVar2 = (int)sz_l;
  do {
    i = iVar2 + -1;
    if (i < 0) {
LAB_00114ebb:
      if (bVar1) {
        out[1] = count;
        count = 0;
        for (i = iVar2 + -2; -1 < i; i = i + -1) {
          count = (uint)l[i] + (uint)delim * count;
        }
        *out = count;
        local_4 = 0;
      }
      else {
        local_4 = -1;
      }
      return local_4;
    }
    if (delim == l[i]) {
      bVar1 = true;
      goto LAB_00114ebb;
    }
    count = (uint)l[i] + (uint)delim * count;
    iVar2 = i;
  } while( true );
}

Assistant:

extern int MAFSA_automaton_val_to_int_pair(const MAFSA_letter *l,
    size_t sz_l, MAFSA_letter delim, int *out)
{
    int i;
    int count;
    int valid = 0;

    for (i = sz_l - 1, count = 0; i >= 0; --i)
    {
        if (delim == l[i])
        {
            valid = 1;
            break;
        }

        count *= delim;
        count += l[i];
    }

    if (0 == valid)
    {
        return -1;
    }

    out[1] = count;

    for (--i, count = 0; i >= 0; --i)
    {
        count *= delim;
        count += l[i];
    }

    out[0] = count;

    return 0;
}